

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O2

void Msat_OrderClean(Msat_Order_t *p,Msat_IntVec_t *vCone)

{
  int iVar1;
  Msat_IntVec_t *pMVar2;
  Msat_IntVec_t *pMVar3;
  long lVar4;
  
  pMVar2 = p->vIndex;
  for (lVar4 = 0; lVar4 < pMVar2->nSize; lVar4 = lVar4 + 1) {
    pMVar2->pArray[lVar4] = 0;
  }
  pMVar3 = p->vHeap;
  lVar4 = 1;
  while( true ) {
    if ((long)vCone->nSize <= lVar4 + -1) {
      pMVar3->nSize = vCone->nSize + 1;
      return;
    }
    if (pMVar3->nCap <= lVar4) break;
    iVar1 = vCone->pArray[lVar4 + -1];
    pMVar3->pArray[lVar4] = iVar1;
    if (pMVar2->nSize <= iVar1) {
      __assert_fail("vCone->pArray[i] < p->vIndex->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatOrderH.c"
                    ,0x82,"void Msat_OrderClean(Msat_Order_t *, Msat_IntVec_t *)");
    }
    pMVar2->pArray[iVar1] = (int)lVar4;
    lVar4 = lVar4 + 1;
  }
  __assert_fail("i+1 < p->vHeap->nCap",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatOrderH.c"
                ,0x7f,"void Msat_OrderClean(Msat_Order_t *, Msat_IntVec_t *)");
}

Assistant:

void Msat_OrderClean( Msat_Order_t * p, Msat_IntVec_t * vCone )
{
    int i;
    for ( i = 0; i < p->vIndex->nSize; i++ )
        p->vIndex->pArray[i] = 0;
    for ( i = 0; i < vCone->nSize; i++ )
    {
        assert( i+1 < p->vHeap->nCap );
        p->vHeap->pArray[i+1] = vCone->pArray[i];

        assert( vCone->pArray[i] < p->vIndex->nSize );
        p->vIndex->pArray[vCone->pArray[i]] = i+1;
    }
    p->vHeap->nSize = vCone->nSize + 1;
}